

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void malloc_conf_init(sc_data_t *sc_data,uint *bin_shard_sizes,char *readlink_buf)

{
  _Bool _Var1;
  char *opts_cache [5];
  char *in_stack_00000308;
  char **in_stack_00000310;
  undefined1 in_stack_0000031f;
  uint *in_stack_00000320;
  sc_data_t *in_stack_00000328;
  undefined1 auStack_48 [72];
  
  memset(auStack_48,0,0x28);
  malloc_conf_init_helper
            (in_stack_00000328,in_stack_00000320,(_Bool)in_stack_0000031f,in_stack_00000310,
             in_stack_00000308);
  malloc_conf_init_helper
            (in_stack_00000328,in_stack_00000320,(_Bool)in_stack_0000031f,in_stack_00000310,
             in_stack_00000308);
  _Var1 = malloc_conf_init_check_deps();
  if ((_Var1) && ((duckdb_je_opt_abort_conf & 1U) != 0)) {
    malloc_abort_invalid_conf();
  }
  return;
}

Assistant:

static void
malloc_conf_init(sc_data_t *sc_data, unsigned bin_shard_sizes[SC_NBINS],
    char readlink_buf[PATH_MAX + 1]) {
	const char *opts_cache[MALLOC_CONF_NSOURCES] = {NULL, NULL, NULL, NULL,
		NULL};

	/* The first call only set the confirm_conf option and opts_cache */
	malloc_conf_init_helper(NULL, NULL, true, opts_cache, readlink_buf);
	malloc_conf_init_helper(sc_data, bin_shard_sizes, false, opts_cache,
	    NULL);
	if (malloc_conf_init_check_deps()) {
		/* check_deps does warning msg only; abort below if needed. */
		if (opt_abort_conf) {
			malloc_abort_invalid_conf();
		}
	}
}